

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImGuiContext *g;
  char *__function;
  float fVar6;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  iVar1 = (GImGui->CurrentWindowStack).Size;
  if (iVar1 < 2) {
    if (GImGui->WithinFrameScopeWithImplicitWindow == true) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                    ,0x17c0,"void ImGui::End()");
    }
    if (iVar1 != 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                    ,0x17c3,"void ImGui::End()");
    }
  }
  if (((pIVar2->Flags & 0x1000000) != 0) && (GImGui->WithinEndChild == false)) {
    __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                  ,0x17c7,"void ImGui::End()");
  }
  if ((pIVar2->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    EndColumns();
  }
  PopClipRect();
  if ((pIVar2->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  iVar1 = (pIVar3->CurrentWindowStack).Size;
  if (0 < iVar1) {
    uVar5 = iVar1 - 1;
    (pIVar3->CurrentWindowStack).Size = uVar5;
    if ((pIVar2->Flags & 0x4000000) != 0) {
      iVar1 = (pIVar3->BeginPopupStack).Size;
      if (iVar1 < 1) {
        __function = "void ImVector<ImGuiPopupData>::pop_back() [T = ImGuiPopupData]";
        goto LAB_0011af79;
      }
      (pIVar3->BeginPopupStack).Size = iVar1 + -1;
    }
    pIVar4 = GImGui;
    if ((pIVar2->IDStack).Size != (int)(pIVar2->DC).StackSizesBackup[0]) {
      __assert_fail("*p == n && \"PushID/PopID or TreeNode/TreePop Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                    ,0x1ad1,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar2->DC).GroupStack.Size != (int)(pIVar2->DC).StackSizesBackup[1]) {
      __assert_fail("*p == n && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                    ,0x1ad2,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((GImGui->BeginPopupStack).Size != (int)(pIVar2->DC).StackSizesBackup[2]) {
      __assert_fail("*p == n && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                    ,0x1ad6,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    if ((GImGui->ColorModifiers).Size <= (int)(pIVar2->DC).StackSizesBackup[3]) {
      if ((int)(pIVar2->DC).StackSizesBackup[4] < (GImGui->StyleModifiers).Size) {
        __assert_fail("*p >= n && \"PushStyleVar/PopStyleVar Mismatch!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                      ,0x1ad8,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)"
                     );
      }
      if ((GImGui->FontStack).Size <= (int)(pIVar2->DC).StackSizesBackup[5]) {
        if (uVar5 == 0) {
          GImGui->CurrentWindow = (ImGuiWindow *)0x0;
        }
        else {
          pIVar2 = (pIVar3->CurrentWindowStack).Data[(ulong)uVar5 - 1];
          GImGui->CurrentWindow = pIVar2;
          if (pIVar2 != (ImGuiWindow *)0x0) {
            fVar6 = pIVar4->FontBaseSize * pIVar2->FontWindowScale;
            if (pIVar2->ParentWindow != (ImGuiWindow *)0x0) {
              fVar6 = fVar6 * pIVar2->ParentWindow->FontWindowScale;
            }
            (pIVar4->DrawListSharedData).FontSize = fVar6;
            pIVar4->FontSize = fVar6;
          }
        }
        return;
      }
      __assert_fail("*p >= n && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                    ,0x1ad9,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
    }
    __assert_fail("*p >= n && \"PushStyleColor/PopStyleColor Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                  ,0x1ad7,"void ImGui::ErrorCheckBeginEndCompareStacksSize(ImGuiWindow *, bool)");
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_0011af79:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                ,0x544,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    ErrorCheckBeginEndCompareStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}